

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_capability.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_3::IsEnabledByExtension(ValidationState_t *_,uint32_t capability)

{
  bool bVar1;
  AssemblyGrammar *this;
  undefined1 local_48 [8];
  ExtensionSet operand_exts;
  spv_operand_desc operand_desc;
  uint32_t capability_local;
  ValidationState_t *__local;
  
  operand_exts.size_ = 0;
  this = ValidationState_t::grammar(_);
  AssemblyGrammar::lookupOperand
            (this,SPV_OPERAND_TYPE_CAPABILITY,capability,(spv_operand_desc *)&operand_exts.size_);
  if (operand_exts.size_ != 0) {
    EnumSet<spvtools::Extension>::EnumSet
              ((EnumSet<spvtools::Extension> *)local_48,*(ElementType *)(operand_exts.size_ + 0x18),
               *(Extension **)(operand_exts.size_ + 0x20));
    bVar1 = EnumSet<spvtools::Extension>::empty((EnumSet<spvtools::Extension> *)local_48);
    if (bVar1) {
      __local._7_1_ = false;
    }
    else {
      __local._7_1_ = ValidationState_t::HasAnyOfExtensions(_,(ExtensionSet *)local_48);
    }
    EnumSet<spvtools::Extension>::~EnumSet((EnumSet<spvtools::Extension> *)local_48);
    return __local._7_1_;
  }
  __assert_fail("operand_desc",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_capability.cpp"
                ,0xef,
                "bool spvtools::val::(anonymous namespace)::IsEnabledByExtension(ValidationState_t &, uint32_t)"
               );
}

Assistant:

bool IsEnabledByExtension(ValidationState_t& _, uint32_t capability) {
  spv_operand_desc operand_desc = nullptr;
  _.grammar().lookupOperand(SPV_OPERAND_TYPE_CAPABILITY, capability,
                            &operand_desc);

  // operand_desc is expected to be not null, otherwise validator would have
  // failed at an earlier stage. This 'assert' is 'just in case'.
  assert(operand_desc);

  ExtensionSet operand_exts(operand_desc->numExtensions,
                            operand_desc->extensions);
  if (operand_exts.empty()) return false;

  return _.HasAnyOfExtensions(operand_exts);
}